

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat-message.c
# Opt level: O1

int main(void)

{
  char cVar1;
  _Bool _Var2;
  size_t sVar3;
  uint8_t *b_00;
  rtosc_arg_t rVar4;
  midi_t m;
  int32_t r;
  float f;
  double d;
  uint64_t t;
  int64_t h;
  rtosc_blob_t b;
  rtosc_arg_t local_40;
  
  f = 0.25;
  b.len = 3;
  b.data = "string";
  h = -0x7d;
  t = 0x578c;
  d = 0.125;
  r = 0x12345678;
  builtin_memcpy(m,"\x12#4E",4);
  sVar3 = rtosc_message(buffer,0x400,"/dest","[ifsbhtdScrmTFNI]",0x3fd0000000000000,
                        0x3fc0000000000000,0x2a,"string",3,"string",0xffffffffffffff83,0x578c,
                        "Symbol",0x19,0x12345678,m);
  assert_int_eq(0x60,(int)sVar3,"Generating A Message With All Arg Types",0x27);
  rVar4 = rtosc_argument(buffer,0);
  assert_int_eq(0x2a,rVar4.i,"Checking \'i\' Argument",0x2c);
  local_40 = rtosc_argument(buffer,1);
  assert_hex_eq((char *)&f,&local_40.T,4,4,"Checking \'f\' Argument",0x2d);
  rVar4 = rtosc_argument(buffer,2);
  assert_str_eq("string",rVar4.s,"Checking \'s\' Argument",0x2f);
  local_40 = rtosc_argument(buffer,3);
  b_00 = local_40.b.data;
  assert_hex_eq((char *)&b,&local_40.T,4,4,"Checking \'b.len\' Argument",0x30);
  assert_hex_eq("string",(char *)b_00,3,3,"Checking \'b.data\' Argument",0x32);
  local_40 = rtosc_argument(buffer,4);
  assert_hex_eq((char *)&h,&local_40.T,8,8,"Checking \'h\' Argument",0x33);
  local_40 = rtosc_argument(buffer,5);
  assert_hex_eq((char *)&t,&local_40.T,8,8,"Checking \'t\' Argument",0x34);
  local_40 = rtosc_argument(buffer,6);
  assert_hex_eq((char *)&d,&local_40.T,8,8,"Checking \'d\' Argument",0x35);
  rVar4 = rtosc_argument(buffer,7);
  assert_str_eq("Symbol",rVar4.s,"Checking \'S\' Argument",0x37);
  rVar4 = rtosc_argument(buffer,8);
  assert_char_eq('\x19',rVar4.T,"Checking \'c\' Argument",0x39);
  local_40 = rtosc_argument(buffer,9);
  assert_hex_eq((char *)&r,&local_40.T,4,4,"Checking \'r\' Argument",0x3a);
  local_40 = rtosc_argument(buffer,10);
  assert_hex_eq((char *)m,&local_40.T,4,4,"Checking \'m\' Argument",0x3b);
  cVar1 = rtosc_type(buffer,0xb);
  assert_char_eq('T',cVar1,"Checking \'T\' Argument",0x3d);
  cVar1 = rtosc_type(buffer,0xc);
  assert_char_eq('F',cVar1,"Checking \'F\' Argument",0x3f);
  cVar1 = rtosc_type(buffer,0xd);
  assert_char_eq('N',cVar1,"Checking \'N\' Argument",0x41);
  cVar1 = rtosc_type(buffer,0xe);
  assert_char_eq('I',cVar1,"Checking \'I\' Argument",0x43);
  _Var2 = rtosc_valid_message_p(buffer,sVar3 & 0xffffffff);
  assert_true((uint)_Var2,"Verifying Message Is Valid",0x45);
  printf("# %d test(s) failed out of %d (currently passing %f%% tests)\n",
         100.0 - ((double)global_err * 100.0) / (double)test_counter);
  return (uint)(global_err != 0);
}

Assistant:

int main()
{
    unsigned message_len;
    int32_t      i = 42;             //integer
    float        f = 0.25;           //float
    const char  *s = "string";       //string
    rtosc_blob_t b = {3,(uint8_t*)s};//blob
    int64_t      h = -125;           //long integer
    uint64_t     t = 22412;          //timetag
    double       d = 0.125;          //double
    const char  *S = "Symbol";       //symbol
    char         c = 25;             //character
    int32_t      r = 0x12345678;     //RGBA
    midi_t       m = {0x12,0x23,     //midi
                      0x34,0x45};
    //true
    //false
    //nil
    //inf

    message_len = rtosc_message(buffer, 1024, "/dest",
                "[ifsbhtdScrmTFNI]", i,f,s,b.len,b.data,h,t,d,S,c,r,m);

    assert_int_eq(96, message_len,
            "Generating A Message With All Arg Types", __LINE__);


    rtosc_arg_t arg;
    assert_int_eq(i, rtosc_argument(buffer, 0).i,
            "Checking 'i' Argument", __LINE__);
    CHECK(f,f,1);
    assert_str_eq(s, rtosc_argument(buffer, 2).s,
            "Checking 's' Argument", __LINE__);
    CHECK(b.len,b.len,3);
    assert_hex_eq((char*)b.data, (char*)arg.b.data, 3, b.len,
            "Checking 'b.data' Argument", __LINE__);
    CHECK(h,h,4);
    CHECK(t,t,5);
    CHECK(d,d,6);
    assert_str_eq(S,rtosc_argument(buffer, 7).s,
            "Checking 'S' Argument", __LINE__);
    assert_char_eq(c,rtosc_argument(buffer, 8).i,
            "Checking 'c' Argument", __LINE__);
    CHECK(r,i,9);
    CHECK(m,m,10);
    assert_char_eq('T', rtosc_type(buffer,11),
            "Checking 'T' Argument", __LINE__);
    assert_char_eq('F', rtosc_type(buffer,12),
            "Checking 'F' Argument", __LINE__);
    assert_char_eq('N', rtosc_type(buffer,13),
            "Checking 'N' Argument", __LINE__);
    assert_char_eq('I', rtosc_type(buffer,14),
            "Checking 'I' Argument", __LINE__);
    assert_true(rtosc_valid_message_p(buffer, message_len),
            "Verifying Message Is Valid", __LINE__);

    return test_summary();
}